

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void QUnifiedTimer::startAnimationTimer(QAbstractAnimationTimer *timer)

{
  QUnifiedTimer *obj;
  
  if (timer->isRegistered == false) {
    timer->isRegistered = true;
    obj = instance(true);
    QList<QAbstractAnimationTimer_*>::append(&obj->animationTimersToStart,timer);
    if (obj->startTimersPending == false) {
      obj->startTimersPending = true;
      QMetaObject::invokeMethod<>(&obj->super_QObject,"startTimers",QueuedConnection);
      return;
    }
  }
  return;
}

Assistant:

void QUnifiedTimer::startAnimationTimer(QAbstractAnimationTimer *timer)
{
    if (timer->isRegistered)
        return;
    timer->isRegistered = true;

    QUnifiedTimer *inst = instance(true); //we create the instance if needed
    inst->animationTimersToStart << timer;
    if (!inst->startTimersPending) {
        inst->startTimersPending = true;
        QMetaObject::invokeMethod(inst, "startTimers", Qt::QueuedConnection);
    }
}